

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaAnalytic_mels.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  N_Vector y;
  N_Vector yp;
  void *returnvalue;
  undefined8 *puVar4;
  N_Vector y_00;
  undefined8 uVar5;
  N_Vector yp_00;
  uint uVar6;
  double dVar7;
  double dVar8;
  int retval;
  double local_90;
  sunrealtype t;
  SUNContext ctx;
  undefined8 *local_78;
  long ncfn;
  long netf;
  long nni;
  long nre;
  long nst;
  void *local_48;
  sunrealtype alpha;
  long nreLS;
  
  alpha = 10.0;
  puts("\nAnalytical DAE test problem:");
  printf("    alpha = %g\n",0x4024000000000000);
  printf("   reltol = %.1e\n",0x3f1a36e2eb1c432d);
  printf("   abstol = %.1e\n\n",0x3e112e0be826d695);
  retval = SUNContext_Create(0,&ctx);
  iVar3 = 1;
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    y = (N_Vector)N_VNew_Serial(2,ctx);
    iVar2 = check_retval(y,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      yp = (N_Vector)N_VClone(y);
      iVar2 = check_retval(yp,"N_VClone",0);
      if (iVar2 == 0) {
        analytical_solution(0.0,y,yp);
        returnvalue = (void *)IDACreate(ctx);
        local_48 = returnvalue;
        iVar2 = check_retval(returnvalue,"IDACreate",0);
        if (iVar2 == 0) {
          retval = IDAInit(0,returnvalue,fres,y,yp);
          iVar2 = check_retval(&retval,"IDAInit",1);
          iVar3 = 1;
          if (iVar2 == 0) {
            retval = IDASetUserData(returnvalue,&alpha);
            iVar2 = check_retval(&retval,"IDASetUserData",1);
            iVar3 = 1;
            if (iVar2 == 0) {
              retval = IDASStolerances(0x3f1a36e2eb1c432d,0x3e112e0be826d695,returnvalue);
              iVar2 = check_retval(&retval,"IDASStolerances",1);
              iVar3 = 1;
              if (iVar2 == 0) {
                puVar4 = (undefined8 *)SUNLinSolNewEmpty(ctx);
                if (puVar4 != (undefined8 *)0x0) {
                  puVar1 = (undefined8 *)puVar4[1];
                  *puVar1 = MatrixEmbeddedLSType;
                  puVar1[8] = MatrixEmbeddedLSSolve;
                  puVar1[0xe] = MatrixEmbeddedLSFree;
                  *puVar4 = returnvalue;
                }
                iVar2 = check_retval(puVar4,"MatrixEmbeddedLS",0);
                if (iVar2 == 0) {
                  retval = IDASetLinearSolver(returnvalue,puVar4,0);
                  iVar2 = check_retval(&retval,"IDASetLinearSolver",1);
                  iVar3 = 1;
                  if (iVar2 == 0) {
                    t = 0.0;
                    local_78 = puVar4;
                    puts("        t          x1         x2");
                    puts("   ----------------------------------");
                    dVar7 = 0.1;
                    dVar8 = 0.0;
                    while (1e-15 < 1.0 - dVar8) {
                      local_90 = dVar7;
                      retval = IDASolve(returnvalue,&t,y,yp,1);
                      iVar3 = check_retval(&retval,"IDASolve",1);
                      if (iVar3 != 0) {
                        return 1;
                      }
                      puVar4 = *(undefined8 **)((long)y->content + 0x10);
                      printf("  %10.6f  %10.6f  %10.6f\n",t,*puVar4,puVar4[1]);
                      if (retval < 0) {
                        fwrite("Solver failure, stopping integration\n",0x25,1,_stderr);
                        break;
                      }
                      dVar7 = 1.0;
                      dVar8 = t;
                      if (local_90 + 0.1 <= 1.0) {
                        dVar7 = local_90 + 0.1;
                      }
                    }
                    puts("   ----------------------------------");
                    retval = IDAGetNumSteps(returnvalue,&nst);
                    check_retval(&retval,"IDAGetNumSteps",1);
                    retval = IDAGetNumResEvals(returnvalue,&nre);
                    check_retval(&retval,"IDAGetNumResEvals",1);
                    retval = IDAGetNumNonlinSolvIters(returnvalue,&nni);
                    check_retval(&retval,"IDAGetNumNonlinSolvIters",1);
                    retval = IDAGetNumErrTestFails(returnvalue,&netf);
                    check_retval(&retval,"IDAGetNumErrTestFails",1);
                    retval = IDAGetNumNonlinSolvConvFails(returnvalue,&ncfn);
                    check_retval(&retval,"IDAGetNumNonlinSolvConvFails",1);
                    retval = IDAGetNumLinResEvals(returnvalue,&nreLS);
                    check_retval(&retval,"IDAGetNumLinResEvals",1);
                    puts("\nFinal Solver Statistics: \n");
                    printf("Number of steps                    = %ld\n",nst);
                    printf("Number of residual evaluations     = %ld\n",nreLS + nre);
                    printf("Number of nonlinear iterations     = %ld\n",nni);
                    printf("Number of error test failures      = %ld\n",netf);
                    printf("Number of nonlinear conv. failures = %ld\n",ncfn);
                    local_90 = t;
                    y_00 = (N_Vector)N_VClone(y);
                    uVar5 = N_VClone(y);
                    yp_00 = (N_Vector)N_VClone(y);
                    analytical_solution(local_90,y_00,yp_00);
                    N_VConst(0x3e112e0be826d695,yp_00);
                    N_VAbs(y_00,uVar5);
                    N_VLinearSum(0x3f1a36e2eb1c432d,uVar5,yp_00,uVar5);
                    dVar7 = (double)N_VMin(uVar5);
                    if (dVar7 <= 0.0) {
                      fwrite("\nSUNDIALS_ERROR: check_ans failed - ewt <= 0\n\n",0x2e,1,_stderr);
                      uVar6 = 0xffffffff;
                    }
                    else {
                      N_VInv(uVar5,uVar5);
                      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,y,y_00,y_00);
                      dVar7 = (double)N_VWrmsNorm(y_00,uVar5);
                      local_90 = (double)CONCAT71(local_90._1_7_,1.0 <= dVar7);
                      if (1.0 <= dVar7) {
                        fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n");
                      }
                      uVar6 = (uint)local_90._0_1_;
                      N_VDestroy(y_00);
                      N_VDestroy(yp_00);
                      N_VDestroy(uVar5);
                    }
                    retval = uVar6;
                    IDAFree(&local_48);
                    SUNLinSolFree(local_78);
                    N_VDestroy(y);
                    N_VDestroy(yp);
                    SUNContext_Free(&ctx);
                    iVar3 = retval;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
  /* SUNDIALS context object */
  SUNContext ctx;

  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(1.0);    /* final time */
  sunrealtype dTout  = SUN_RCONST(0.1);    /* time between outputs */
  sunindextype NEQ   = 2;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-4); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-9);
  sunrealtype alpha  = SUN_RCONST(10.0); /* stiffness parameter */

  /* general problem variables */
  int retval;                /* reusable error-checking flag */
  N_Vector yy        = NULL; /* empty vector for storing solution */
  N_Vector yp        = NULL; /* empty vector for storing solution derivative */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* ida_mem      = NULL; /* empty IDA memory structure */
  sunrealtype t, tout;
  long int nst, nre, nni, netf, ncfn, nreLS;

  /* Initial diagnostics output */
  printf("\nAnalytical DAE test problem:\n");
  printf("    alpha = %" GSYM "\n", alpha);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Initialize data structures */
  yy = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return 1; }
  yp = N_VClone(yy); /* Create serial vector for solution derivative */
  if (check_retval((void*)yp, "N_VClone", 0)) { return 1; }
  analytical_solution(T0, yy, yp); /* Specify initial conditions */

  /* Call IDACreate and IDAInit to initialize IDA memory */
  ida_mem = IDACreate(ctx);
  if (check_retval((void*)ida_mem, "IDACreate", 0)) { return (1); }
  retval = IDAInit(ida_mem, fres, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Set routines */
  retval = IDASetUserData(ida_mem, (void*)&alpha);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }
  retval = IDASStolerances(ida_mem, reltol, abstol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create custom matrix-embedded linear solver */
  LS = MatrixEmbeddedLS(ida_mem, ctx);
  if (check_retval((void*)LS, "MatrixEmbeddedLS", 0)) { return 1; }

  /* Attach the linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, NULL);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* In loop, call IDASolve, print results, and test for error.
     Stops when the final time has been reached. */
  t    = T0;
  tout = T0 + dTout;
  printf("        t          x1         x2\n");
  printf("   ----------------------------------\n");
  while (Tf - t > 1.0e-15)
  {
    retval = IDASolve(ida_mem, tout, &t, yy, yp, IDA_NORMAL); /* call integrator */
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(yy, 0), NV_Ith_S(yy, 1)); /* access/print solution */
    if (retval >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ----------------------------------\n");

  /* Get/print some final statistics on how the solve progressed */
  retval = IDAGetNumSteps(ida_mem, &nst);
  check_retval(&retval, "IDAGetNumSteps", 1);
  retval = IDAGetNumResEvals(ida_mem, &nre);
  check_retval(&retval, "IDAGetNumResEvals", 1);
  retval = IDAGetNumNonlinSolvIters(ida_mem, &nni);
  check_retval(&retval, "IDAGetNumNonlinSolvIters", 1);
  retval = IDAGetNumErrTestFails(ida_mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);
  retval = IDAGetNumNonlinSolvConvFails(ida_mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);
  retval = IDAGetNumLinResEvals(ida_mem, &nreLS);
  check_retval(&retval, "IDAGetNumLinResEvals", 1);

  printf("\nFinal Solver Statistics: \n\n");
  printf("Number of steps                    = %ld\n", nst);
  printf("Number of residual evaluations     = %ld\n", nre + nreLS);
  printf("Number of nonlinear iterations     = %ld\n", nni);
  printf("Number of error test failures      = %ld\n", netf);
  printf("Number of nonlinear conv. failures = %ld\n", ncfn);

  /* check the solution error */
  retval = check_ans(yy, t, reltol, abstol);

  /* Clean up and return */
  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  N_VDestroy(yy);
  N_VDestroy(yp);
  SUNContext_Free(&ctx);

  return (retval);
}